

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall
Jupiter::Timer::Timer
          (Timer *this,uint in_iterations,milliseconds in_delay,FunctionType in_function,
          void *in_parameters,bool in_immediate)

{
  Timer *local_60;
  duration local_58;
  rep local_50;
  byte local_31;
  void *pvStack_30;
  bool in_immediate_local;
  void *in_parameters_local;
  FunctionType in_function_local;
  Timer *pTStack_18;
  uint in_iterations_local;
  Timer *this_local;
  milliseconds in_delay_local;
  
  local_31 = in_immediate;
  pvStack_30 = in_parameters;
  in_parameters_local = in_function;
  in_function_local._4_4_ = in_iterations;
  pTStack_18 = this;
  this_local = (Timer *)in_delay.__r;
  Thinker::Thinker(&this->super_Thinker);
  (this->super_Thinker)._vptr_Thinker = (_func_int **)&PTR_think_001eaab8;
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->m_next_call);
  this->m_function = (FunctionType)in_parameters_local;
  this->m_parameters = pvStack_30;
  this->m_iterations = in_function_local._4_4_;
  (this->m_delay).__r = (rep)this_local;
  local_50 = std::chrono::_V2::steady_clock::now();
  (this->m_next_call).__d.__r = local_50;
  if ((local_31 & 1) == 0) {
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_58,&this->m_delay);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::operator+=(&this->m_next_call,&local_58);
  }
  local_60 = this;
  std::__cxx11::list<Jupiter::Timer_*,_std::allocator<Jupiter::Timer_*>_>::push_back
            (&o_timers_abi_cxx11_,&local_60);
  return;
}

Assistant:

Jupiter::Timer::Timer(unsigned int in_iterations, std::chrono::milliseconds in_delay, FunctionType in_function, void *in_parameters, bool in_immediate)
{
	m_function = in_function;
	m_parameters = in_parameters;
	m_iterations = in_iterations;
	m_delay = in_delay;
	m_next_call = std::chrono::steady_clock::now();

	if (in_immediate == false)
		m_next_call += m_delay;

	o_timers.push_back(this);
}